

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VarBinds.h
# Opt level: O1

void __thiscall VarBind::VarBind(VarBind *this,SortableOIDType *oid,SNMP_ERROR_STATUS error)

{
  element_type *__p;
  
  OIDType::cloneOID((OIDType *)this);
  this->type = NULLTYPE;
  __p = (element_type *)operator_new(0x10);
  *(undefined8 *)&__p->_type = 5;
  ((BER_CONTAINER *)&__p->_vptr_BER_CONTAINER)->_vptr_BER_CONTAINER =
       (_func_int **)&PTR__BER_CONTAINER_001a4730;
  (this->value).super___shared_ptr<BER_CONTAINER,_(__gnu_cxx::_Lock_policy)2>._M_ptr = __p;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<NullType*>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &(this->value).super___shared_ptr<BER_CONTAINER,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,(NullType *)__p);
  this->errorStatus = error;
  return;
}

Assistant:

VarBind(const SortableOIDType* oid, const std::shared_ptr<BER_CONTAINER>& value): oid(oid->cloneOID()), type(value->_type), value(value){}